

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O2

int ztlex_ishex(ztlex_t *lex)

{
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = (*lex->getC)(lex);
  uVar4 = (ulong)uVar1;
  if (uVar1 != 0xffffffff) {
    if (uVar1 == 0x30) {
      lex->lexeme[0] = '0';
      iVar2 = (*lex->getC)(lex);
      uVar4 = 1;
      if (iVar2 != -1) {
        if (iVar2 != 0x78) goto LAB_0010305d;
        iVar2 = 0x78;
        uVar6 = 0;
        do {
          uVar5 = uVar6;
          lex->lexeme[uVar5 + 1] = (char)iVar2;
          uVar6 = uVar5 + 1;
          iVar2 = (*lex->getC)(lex);
          ppuVar3 = __ctype_b_loc();
          if (0xfd < uVar6) break;
        } while (((*ppuVar3)[iVar2] & 0x1000) != 0);
        if ((iVar2 != -1) && (((*ppuVar3)[iVar2] & 0x1000) == 0)) {
          (*lex->ungetC)(iVar2,lex);
        }
        uVar4 = uVar5 + 2;
        if (1 < uVar6) {
          lex->lexeme[uVar5 + 2] = '\0';
          goto LAB_0010306b;
        }
      }
      while (0 < (long)uVar4) {
        iVar2 = (int)lex->lexeme[uVar4 - 1];
        uVar4 = uVar4 - 1;
LAB_0010305d:
        (*lex->ungetC)(iVar2,lex);
      }
    }
    else {
      (*lex->ungetC)(uVar1,lex);
    }
    uVar4 = 0;
  }
LAB_0010306b:
  return (int)uVar4;
}

Assistant:

int ztlex_ishex(ztlex_t *lex)
{
  int i = 0;
  int c;

  c = lex->getC(lex);
  if (c == EOF)
    return EOF;

  if (c != '0')
  {
    lex->ungetC(c, lex);
    return 0;
  }

  lex->lexeme[i++] = c;

  c = lex->getC(lex);
  if (c != 'x') /* including EOF */
  {
    if (c != EOF)
      lex->ungetC(c, lex);
    goto undo;
  }

  do
  {
    lex->lexeme[i++] = c;
    c = lex->getC(lex);
  }
  while (isxdigit(c) && i < MAXLEXEME - 1);

  if (c != EOF && !isxdigit(c))
    lex->ungetC(c, lex);

  if (i < 3)
  {
undo:
    while (--i >= 0)
      lex->ungetC(lex->lexeme[i], lex);
    return 0;
  }

  lex->lexeme[i] = '\0';
  return i;
}